

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O0

char_type_conflict __thiscall toml::detail::location::current(location *this)

{
  bool bVar1;
  const_reference pvVar2;
  location *in_RDI;
  location *this_00;
  undefined1 local_1;
  
  this_00 = in_RDI;
  bVar1 = eof(in_RDI);
  if (bVar1) {
    local_1 = '\0';
  }
  else {
    CLI::std::
    __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17ae4d);
    pvVar2 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                        (size_type)in_RDI);
    local_1 = *pvVar2;
  }
  return local_1;
}

Assistant:

TOML11_INLINE location::char_type location::current() const
{
    assert(this->is_ok());
    if(this->eof()) {return '\0';}

    assert(this->location_ < this->source_->size());
    return this->source_->at(this->location_);
}